

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::InputFloatN(char *label,float *v,int components,int decimal_precision,
                       ImGuiInputTextFlags extra_flags)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  char *text_end;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  float w_full;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  uVar6 = 0;
  if (pIVar3->SkipItems == false) {
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,w_full);
    uVar7 = (ulong)(uint)components;
    if (components < 1) {
      uVar7 = uVar6;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      PushID((int)uVar8);
      bVar5 = InputFloat("##v",v,0.0,0.0,decimal_precision,extra_flags);
      uVar6 = (ulong)(byte)((byte)uVar6 | bVar5);
      SameLine(0.0,(pIVar4->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
      v = v + 1;
    }
    PopID();
    fVar1 = (pIVar3->DC).CurrentLineTextBaseOffset;
    fVar2 = (pIVar4->Style).FramePadding.y;
    uVar9 = -(uint)(fVar2 <= fVar1);
    (pIVar3->DC).CurrentLineTextBaseOffset = (float)(~uVar9 & (uint)fVar2 | (uint)fVar1 & uVar9);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
  }
  return SUB81(uVar6,0);
}

Assistant:

bool ImGui::InputFloatN(const char* label, float* v, int components, int decimal_precision, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= InputFloat("##v", &v[i], 0, 0, decimal_precision, extra_flags);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.CurrentLineTextBaseOffset, g.Style.FramePadding.y);
    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}